

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_cycleselect(_glist *x,t_float foffset)

{
  t_editor *ptVar1;
  _instanceeditor *p_Var2;
  t_selection *ptVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  t_gobj *ptVar8;
  t_object *x_00;
  _outconnect *oc;
  t_object *x_01;
  _glist *p_Var9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int snkX2;
  int snkX1;
  int srcX2;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int srcX1;
  t_object *local_a0;
  int local_94;
  t_object *local_90;
  int local_74;
  
  ptVar1 = x->gl_editor;
  if (ptVar1 == (t_editor *)0x0) {
    return;
  }
  iVar15 = (int)foffset;
  if ((ptVar1->field_0x88 & 7) == 2) {
    iVar7 = ptVar1->e_xwas;
    p_Var2 = (pd_maininstance.pd_gui)->i_editor;
    iVar10 = *(int *)(p_Var2 + 0x80);
    iVar14 = *(int *)(p_Var2 + 0x84);
    srcX1 = 0;
    srcX2 = 0;
    snkX1 = 0;
    snkX2 = 0;
    if (*(_glist **)(p_Var2 + 0x78) != x) {
      return;
    }
    ptVar8 = canvas_findhitbox(x,iVar7,ptVar1->e_ywas,&srcX1,&local_ac,&srcX2,&local_b0);
    if (ptVar8 == (t_gobj *)0x0) {
      x_00 = (t_object *)0x0;
    }
    else {
      x_00 = pd_checkobject(&ptVar8->g_pd);
    }
    ptVar8 = canvas_findhitbox(x,iVar10,iVar14,&snkX1,&local_b4,&snkX2,&local_b8);
    if (ptVar8 == (t_gobj *)0x0) {
      x_01 = (t_object *)0x0;
    }
    else {
      x_01 = pd_checkobject(&ptVar8->g_pd);
    }
    iVar4 = srcX1;
    iVar12 = srcX2;
    iVar6 = snkX1;
    iVar11 = snkX2;
    if (x_00 == (t_object *)0x0) {
      return;
    }
    if ((x_01 != (t_object *)0x0) && (x_01 != x_00)) {
      iVar7 = obj_ninlets(x_01);
      if (iVar7 < 2) {
        return;
      }
      iVar11 = iVar11 - iVar6;
      iVar15 = ((iVar11 / 2 + (iVar7 + -1) * (iVar10 - iVar6)) / iVar11 + iVar15) % iVar7 + iVar7;
      p_Var9 = glist_getcanvas((_glist *)((long)iVar15 / (long)iVar7 & 0xffffffff));
      pdgui_vmess("::pdtk_canvas::setmouse","cii",p_Var9,
                  (ulong)(uint)(int)((double)((iVar11 + -7) * (iVar15 % iVar7)) /
                                     ((double)iVar7 + -1.0) + (double)iVar6 + 3.5),iVar14);
      return;
    }
    iVar11 = obj_noutlets(x_00);
    if (iVar11 < 2) {
      return;
    }
    iVar12 = iVar12 - iVar4;
    x->gl_editor->e_xwas =
         (int)((double)((iVar12 + -7) *
                       ((((iVar12 / 2 + (iVar11 + -1) * (iVar7 - iVar4)) / iVar12 + iVar15) % iVar11
                        + iVar11) % iVar11)) / ((double)iVar11 + -1.0) + (double)iVar4 + 3.5);
    canvas_doconnect(x,iVar10,iVar14,0,0);
    return;
  }
  ptVar3 = ptVar1->e_selection;
  if (ptVar3 != (t_selection *)0x0) {
    uVar5 = glist_getindex(x,(t_gobj *)0x0);
    if (ptVar3->sel_next != (_selection *)0x0) {
      return;
    }
    ptVar8 = ptVar3->sel_what;
    if (uVar5 == 0 || ptVar8 == (t_gobj *)0x0) {
      return;
    }
    iVar7 = glist_getindex(x,ptVar8);
    iVar15 = (iVar7 + iVar15) % (int)uVar5;
    glist_deselect(x,ptVar8);
    ptVar8 = glist_nth(x,(iVar15 >> 0x1f & uVar5) + iVar15);
    glist_select(x,ptVar8);
    return;
  }
  if ((ptVar1->field_0x88 & 0x20) == 0) {
    return;
  }
  linetraverser_start((t_linetraverser *)&srcX1,x);
  iVar7 = 0;
  oc = (_outconnect *)0x0;
  iVar10 = 0;
  do {
    uVar5 = 0;
    while( true ) {
      iVar14 = iVar15 - uVar5;
      if (iVar14 == 0) goto LAB_0013f88c;
      oc = linetraverser_next((t_linetraverser *)&srcX1);
      if (oc == (_outconnect *)0x0) {
        iVar7 = iVar7 + uVar5;
        if (iVar7 == 0) {
          return;
        }
        uVar13 = (long)((int)(~uVar5 + iVar15) % iVar7 + iVar7) % (long)iVar7 & 0xffffffff;
        linetraverser_start((t_linetraverser *)&srcX1,x);
        goto LAB_0013f872;
      }
      if (iVar10 == 0) break;
      uVar5 = uVar5 + 1;
    }
    iVar11 = glist_getindex(x,&local_a0->te_g);
    iVar6 = glist_getindex(x,&local_90->te_g);
    ptVar1 = x->gl_editor;
    iVar7 = iVar7 + uVar5 + 1;
    iVar10 = 0;
    iVar15 = iVar14;
    if ((((iVar11 == ptVar1->e_selectline_index1) && (local_94 == ptVar1->e_selectline_outno)) &&
        (iVar6 == ptVar1->e_selectline_index2)) &&
       (iVar10 = 0, local_74 == ptVar1->e_selectline_inno)) {
      iVar10 = iVar7;
    }
  } while( true );
  while (iVar15 != 0) {
LAB_0013f872:
    oc = linetraverser_next((t_linetraverser *)&srcX1);
    iVar15 = (int)uVar13;
    uVar13 = (ulong)(iVar15 - 1);
    if (oc == (_outconnect *)0x0) break;
  }
LAB_0013f88c:
  if (oc != (_outconnect *)0x0) {
    iVar15 = glist_getindex(x,&local_a0->te_g);
    iVar7 = glist_getindex(x,&local_90->te_g);
    glist_selectline(x,oc,iVar15,local_94,iVar7,local_74);
  }
  return;
}

Assistant:

static void canvas_cycleselect(t_canvas*x, t_float foffset)
{
        /* select (currentselection+offset)%objectcount */
    int offset = (int)foffset;
    if (!x->gl_editor)
        return;

    if (x->gl_editor->e_onmotion == MA_CONNECT)
    {
            /* during connection, cycle through inlets/outlets */
        int xwas = x->gl_editor->e_xwas,
            ywas = x->gl_editor->e_ywas;
        int xpos = EDITOR->canvas_last_glist_x,
            ypos = EDITOR->canvas_last_glist_y;
        t_object *src, *snk;
        t_gobj*gobj;
        int srcX1=0, srcY1=0, srcX2=0, srcY2=0;
        int snkX1=0, snkY1=0, snkX2=0, snkY2=0;
        if(EDITOR->canvas_last_glist != x)
                /* we don't know the current mouse coordinates in this canvas, so return... */
            return;
        gobj = canvas_findhitbox(x, xwas, ywas, &srcX1, &srcY1, &srcX2, &srcY2);
        src = gobj?pd_checkobject(&gobj->g_pd):0;
        gobj = canvas_findhitbox(x, xpos, ypos, &snkX1, &snkY1, &snkX2, &snkY2);
        snk = gobj?pd_checkobject(&gobj->g_pd):0;

        if(!src) /* this should never happen */
            return;

            /* are we hovering over an object?
             * - if so, cycle through inlets
             * - else, cycle through outlets
             */
        if(snk && snk != src) {
                /* cycle inlets */
            int width = snkX2 - snkX1, hotspot, closest;
            int nios = obj_ninlets(snk);
            if (nios <= 1) /* no use cycling */
                return;
            closest = ((xpos-snkX1) * (nios-1) + width/2)/width;
            closest = ((closest + offset) % nios + nios) % nios;
            hotspot = snkX1 + (width - IOWIDTH) * closest / (nios-1.0) + IOWIDTH*0.5;
            pdgui_vmess("::pdtk_canvas::setmouse", "cii",  glist_getcanvas(x), hotspot, ypos);
        } else {
                /* cycle outlets */
            int width = srcX2 - srcX1, hotspot, closest;
            int nios = obj_noutlets(src);
            if (nios <= 1) /* no use cycling */
                return;
            closest = ((xwas-srcX1) * (nios-1) + width/2)/width;
            closest = ((closest + offset) % nios + nios) % nios;
            hotspot = srcX1 + (width - IOWIDTH) * closest / (nios-1.0) + IOWIDTH*0.5;
            x->gl_editor->e_xwas = hotspot;
            canvas_doconnect(x, xpos, ypos, 0, 0);
        }
        return;
    }
    if (x->gl_editor->e_selection)
    {
            /* cycle the selection to the next object */
        int newindex;
        int objectcount = glist_getindex(x, 0);
            /* only cycle selection if the current selection contains exactly 1 item */
        t_gobj* y = x->gl_editor->e_selection->sel_next ? 0 : x->gl_editor->e_selection->sel_what;
        if (!y || !objectcount)
            return;
        newindex = (glist_getindex(x, y) + offset) % objectcount;
        if (newindex < 0) newindex += objectcount;
        glist_deselect(x, y);
        glist_select(x, glist_nth(x, newindex));
        return;
    }
    if (x->gl_editor->e_selectedline)
    {
            /* if (only) a line is selected, cycle to next line */
        int connectioncount = 0;
        int foundit = 0;
        t_linetraverser t;
        t_outconnect *oc = 0;

        linetraverser_start(&t, x);
        while (offset && (oc = linetraverser_next(&t)))
        {
            connectioncount++;
            if(!foundit) {
                int srcno = glist_getindex(x, &t.tr_ob->ob_g);
                int sinkno = glist_getindex(x, &t.tr_ob2->ob_g);
                if((srcno      == x->gl_editor->e_selectline_index1) &&
                    (t.tr_outno == x->gl_editor->e_selectline_outno) &&
                    (sinkno     == x->gl_editor->e_selectline_index2) &&
                    (t.tr_inno  == x->gl_editor->e_selectline_inno)) {
                    foundit = connectioncount;
                }
            } else
                offset--;
        }

        if (!connectioncount)
            offset = 0;

            /* if the offset is non-0, wrap it... */
        if (offset)
        {
            offset = (((offset - 1) % connectioncount) + connectioncount)
                % connectioncount;
            /* ... and start from the beginning */
            linetraverser_start(&t, x);
            while ((oc = linetraverser_next(&t)))
            {
                if(!offset)break;
                offset--;
            }
        }
        if (oc)
            glist_selectline(x, oc,
                glist_getindex(x, &t.tr_ob->ob_g), t.tr_outno,
                glist_getindex(x, &t.tr_ob2->ob_g), t.tr_inno);
        return;
    }
}